

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O1

int Load_ARB_shader_objects(void)

{
  uint uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  bool bVar35;
  bool bVar36;
  bool bVar37;
  
  sf_ptrc_glAttachObjectARB =
       (_func_void_GLhandleARB_GLhandleARB *)sf::Context::getFunction("glAttachObjectARB");
  bVar19 = sf_ptrc_glAttachObjectARB == (_func_void_GLhandleARB_GLhandleARB *)0x0;
  sf_ptrc_glCompileShaderARB =
       (_func_void_GLhandleARB *)sf::Context::getFunction("glCompileShaderARB");
  uVar1 = bVar19 + 1;
  if (sf_ptrc_glCompileShaderARB != (_func_void_GLhandleARB *)0x0) {
    uVar1 = (uint)bVar19;
  }
  sf_ptrc_glCreateProgramObjectARB =
       (_func_GLhandleARB *)sf::Context::getFunction("glCreateProgramObjectARB");
  bVar19 = sf_ptrc_glCreateProgramObjectARB == (_func_GLhandleARB *)0x0;
  sf_ptrc_glCreateShaderObjectARB =
       (_func_GLhandleARB_GLenum *)sf::Context::getFunction("glCreateShaderObjectARB");
  bVar20 = sf_ptrc_glCreateShaderObjectARB == (_func_GLhandleARB_GLenum *)0x0;
  sf_ptrc_glDeleteObjectARB =
       (_func_void_GLhandleARB *)sf::Context::getFunction("glDeleteObjectARB");
  bVar2 = sf_ptrc_glDeleteObjectARB == (_func_void_GLhandleARB *)0x0;
  sf_ptrc_glDetachObjectARB =
       (_func_void_GLhandleARB_GLhandleARB *)sf::Context::getFunction("glDetachObjectARB");
  bVar21 = sf_ptrc_glDetachObjectARB == (_func_void_GLhandleARB_GLhandleARB *)0x0;
  sf_ptrc_glGetActiveUniformARB =
       (_func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *)
       sf::Context::getFunction("glGetActiveUniformARB");
  bVar3 = sf_ptrc_glGetActiveUniformARB ==
          (_func_void_GLhandleARB_GLuint_GLsizei_GLsizei_ptr_GLint_ptr_GLenum_ptr_GLcharARB_ptr *)
          0x0;
  sf_ptrc_glGetAttachedObjectsARB =
       (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLhandleARB_ptr *)
       sf::Context::getFunction("glGetAttachedObjectsARB");
  bVar22 = sf_ptrc_glGetAttachedObjectsARB ==
           (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLhandleARB_ptr *)0x0;
  sf_ptrc_glGetHandleARB = (_func_GLhandleARB_GLenum *)sf::Context::getFunction("glGetHandleARB");
  bVar4 = sf_ptrc_glGetHandleARB == (_func_GLhandleARB_GLenum *)0x0;
  sf_ptrc_glGetInfoLogARB =
       (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *)
       sf::Context::getFunction("glGetInfoLogARB");
  bVar23 = sf_ptrc_glGetInfoLogARB ==
           (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *)0x0;
  sf_ptrc_glGetObjectParameterfvARB =
       (_func_void_GLhandleARB_GLenum_GLfloat_ptr *)
       sf::Context::getFunction("glGetObjectParameterfvARB");
  bVar5 = sf_ptrc_glGetObjectParameterfvARB == (_func_void_GLhandleARB_GLenum_GLfloat_ptr *)0x0;
  sf_ptrc_glGetObjectParameterivARB =
       (_func_void_GLhandleARB_GLenum_GLint_ptr *)
       sf::Context::getFunction("glGetObjectParameterivARB");
  bVar24 = sf_ptrc_glGetObjectParameterivARB == (_func_void_GLhandleARB_GLenum_GLint_ptr *)0x0;
  sf_ptrc_glGetShaderSourceARB =
       (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *)
       sf::Context::getFunction("glGetShaderSourceARB");
  bVar6 = sf_ptrc_glGetShaderSourceARB ==
          (_func_void_GLhandleARB_GLsizei_GLsizei_ptr_GLcharARB_ptr *)0x0;
  sf_ptrc_glGetUniformLocationARB =
       (_func_GLint_GLhandleARB_GLcharARB_ptr *)sf::Context::getFunction("glGetUniformLocationARB");
  bVar25 = sf_ptrc_glGetUniformLocationARB == (_func_GLint_GLhandleARB_GLcharARB_ptr *)0x0;
  sf_ptrc_glGetUniformfvARB =
       (_func_void_GLhandleARB_GLint_GLfloat_ptr *)sf::Context::getFunction("glGetUniformfvARB");
  bVar7 = sf_ptrc_glGetUniformfvARB == (_func_void_GLhandleARB_GLint_GLfloat_ptr *)0x0;
  sf_ptrc_glGetUniformivARB =
       (_func_void_GLhandleARB_GLint_GLint_ptr *)sf::Context::getFunction("glGetUniformivARB");
  bVar26 = sf_ptrc_glGetUniformivARB == (_func_void_GLhandleARB_GLint_GLint_ptr *)0x0;
  sf_ptrc_glLinkProgramARB = (_func_void_GLhandleARB *)sf::Context::getFunction("glLinkProgramARB");
  bVar8 = sf_ptrc_glLinkProgramARB == (_func_void_GLhandleARB *)0x0;
  sf_ptrc_glShaderSourceARB =
       (_func_void_GLhandleARB_GLsizei_GLcharARB_ptr_ptr_GLint_ptr *)
       sf::Context::getFunction("glShaderSourceARB");
  bVar27 = sf_ptrc_glShaderSourceARB ==
           (_func_void_GLhandleARB_GLsizei_GLcharARB_ptr_ptr_GLint_ptr *)0x0;
  sf_ptrc_glUniform1fARB = (_func_void_GLint_GLfloat *)sf::Context::getFunction("glUniform1fARB");
  bVar9 = sf_ptrc_glUniform1fARB == (_func_void_GLint_GLfloat *)0x0;
  sf_ptrc_glUniform1fvARB =
       (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform1fvARB");
  bVar28 = sf_ptrc_glUniform1fvARB == (_func_void_GLint_GLsizei_GLfloat_ptr *)0x0;
  sf_ptrc_glUniform1iARB = (_func_void_GLint_GLint *)sf::Context::getFunction("glUniform1iARB");
  bVar10 = sf_ptrc_glUniform1iARB == (_func_void_GLint_GLint *)0x0;
  sf_ptrc_glUniform1ivARB =
       (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform1ivARB");
  bVar29 = sf_ptrc_glUniform1ivARB == (_func_void_GLint_GLsizei_GLint_ptr *)0x0;
  sf_ptrc_glUniform2fARB =
       (_func_void_GLint_GLfloat_GLfloat *)sf::Context::getFunction("glUniform2fARB");
  bVar11 = sf_ptrc_glUniform2fARB == (_func_void_GLint_GLfloat_GLfloat *)0x0;
  sf_ptrc_glUniform2fvARB =
       (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform2fvARB");
  bVar30 = sf_ptrc_glUniform2fvARB == (_func_void_GLint_GLsizei_GLfloat_ptr *)0x0;
  sf_ptrc_glUniform2iARB =
       (_func_void_GLint_GLint_GLint *)sf::Context::getFunction("glUniform2iARB");
  bVar12 = sf_ptrc_glUniform2iARB == (_func_void_GLint_GLint_GLint *)0x0;
  sf_ptrc_glUniform2ivARB =
       (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform2ivARB");
  bVar31 = sf_ptrc_glUniform2ivARB == (_func_void_GLint_GLsizei_GLint_ptr *)0x0;
  sf_ptrc_glUniform3fARB =
       (_func_void_GLint_GLfloat_GLfloat_GLfloat *)sf::Context::getFunction("glUniform3fARB");
  bVar13 = sf_ptrc_glUniform3fARB == (_func_void_GLint_GLfloat_GLfloat_GLfloat *)0x0;
  sf_ptrc_glUniform3fvARB =
       (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform3fvARB");
  bVar32 = sf_ptrc_glUniform3fvARB == (_func_void_GLint_GLsizei_GLfloat_ptr *)0x0;
  sf_ptrc_glUniform3iARB =
       (_func_void_GLint_GLint_GLint_GLint *)sf::Context::getFunction("glUniform3iARB");
  bVar14 = sf_ptrc_glUniform3iARB == (_func_void_GLint_GLint_GLint_GLint *)0x0;
  sf_ptrc_glUniform3ivARB =
       (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform3ivARB");
  bVar33 = sf_ptrc_glUniform3ivARB == (_func_void_GLint_GLsizei_GLint_ptr *)0x0;
  sf_ptrc_glUniform4fARB =
       (_func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *)
       sf::Context::getFunction("glUniform4fARB");
  bVar15 = sf_ptrc_glUniform4fARB == (_func_void_GLint_GLfloat_GLfloat_GLfloat_GLfloat *)0x0;
  sf_ptrc_glUniform4fvARB =
       (_func_void_GLint_GLsizei_GLfloat_ptr *)sf::Context::getFunction("glUniform4fvARB");
  bVar34 = sf_ptrc_glUniform4fvARB == (_func_void_GLint_GLsizei_GLfloat_ptr *)0x0;
  sf_ptrc_glUniform4iARB =
       (_func_void_GLint_GLint_GLint_GLint_GLint *)sf::Context::getFunction("glUniform4iARB");
  bVar16 = sf_ptrc_glUniform4iARB == (_func_void_GLint_GLint_GLint_GLint_GLint *)0x0;
  sf_ptrc_glUniform4ivARB =
       (_func_void_GLint_GLsizei_GLint_ptr *)sf::Context::getFunction("glUniform4ivARB");
  bVar35 = sf_ptrc_glUniform4ivARB == (_func_void_GLint_GLsizei_GLint_ptr *)0x0;
  sf_ptrc_glUniformMatrix2fvARB =
       (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
       sf::Context::getFunction("glUniformMatrix2fvARB");
  bVar17 = sf_ptrc_glUniformMatrix2fvARB == (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)0x0;
  sf_ptrc_glUniformMatrix3fvARB =
       (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
       sf::Context::getFunction("glUniformMatrix3fvARB");
  bVar36 = sf_ptrc_glUniformMatrix3fvARB == (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)0x0;
  sf_ptrc_glUniformMatrix4fvARB =
       (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)
       sf::Context::getFunction("glUniformMatrix4fvARB");
  bVar18 = sf_ptrc_glUniformMatrix4fvARB == (_func_void_GLint_GLsizei_GLboolean_GLfloat_ptr *)0x0;
  sf_ptrc_glUseProgramObjectARB =
       (_func_void_GLhandleARB *)sf::Context::getFunction("glUseProgramObjectARB");
  bVar37 = sf_ptrc_glUseProgramObjectARB == (_func_void_GLhandleARB *)0x0;
  sf_ptrc_glValidateProgramARB =
       (_func_void_GLhandleARB *)sf::Context::getFunction("glValidateProgramARB");
  return (uint)bVar37 +
         (uint)bVar36 +
         (uint)bVar35 +
         (uint)bVar34 +
         (uint)bVar33 +
         (uint)bVar32 +
         (uint)bVar31 +
         (uint)bVar30 +
         (uint)bVar29 +
         (uint)bVar28 +
         (uint)bVar27 +
         (uint)bVar26 +
         (uint)bVar25 +
         (uint)bVar24 +
         (uint)bVar23 +
         (uint)bVar22 + (uint)bVar21 + (uint)bVar20 + uVar1 + bVar19 + (uint)bVar2 + (uint)bVar3 +
         (uint)bVar4 + (uint)bVar5 + (uint)bVar6 + (uint)bVar7 + (uint)bVar8 + (uint)bVar9 +
         (uint)bVar10 + (uint)bVar11 + (uint)bVar12 + (uint)bVar13 + (uint)bVar14 + (uint)bVar15 +
         (uint)bVar16 + (uint)bVar17 + (uint)bVar18 +
         (uint)(sf_ptrc_glValidateProgramARB == (_func_void_GLhandleARB *)0x0);
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}